

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O1

vector<duckdb::PartitionStatistics,_true> * __thiscall
duckdb::LocalStorage::GetPartitionStats
          (vector<duckdb::PartitionStatistics,_true> *__return_storage_ptr__,LocalStorage *this,
          DataTable *table)

{
  RowGroupCollection *this_00;
  optional_ptr<duckdb::LocalTableStorage,_true> storage;
  optional_ptr<duckdb::LocalTableStorage,_true> local_18;
  
  local_18 = LocalTableManager::GetStorage(&this->table_manager,table);
  if (local_18.ptr == (LocalTableStorage *)0x0) {
    (__return_storage_ptr__->
    super_vector<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>).
    super__Vector_base<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>).
    super__Vector_base<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>).
    super__Vector_base<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    optional_ptr<duckdb::LocalTableStorage,_true>::CheckValid(&local_18);
    this_00 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&(local_18.ptr)->row_groups);
    RowGroupCollection::GetPartitionStats(__return_storage_ptr__,this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<PartitionStatistics> LocalStorage::GetPartitionStats(DataTable &table) const {
	auto storage = table_manager.GetStorage(table);
	if (!storage) {
		return vector<PartitionStatistics>();
	}
	return storage->row_groups->GetPartitionStats();
}